

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::DatagramPortImpl::ReceiverImpl::receive(ReceiverImpl *this)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  PromiseArena *pPVar7;
  long lVar8;
  int *piVar9;
  undefined1 auVar10 [8];
  OwnPromiseNode node;
  char cVar11;
  int iVar12;
  ssize_t sVar13;
  void *pvVar14;
  ulong uVar15;
  cmsghdr *__cmsg;
  undefined8 *puVar16;
  ulong uVar17;
  PromiseArena *in_RSI;
  size_t newSize;
  byte *pos;
  TransformPromiseNodeBase *this_00;
  Fault f;
  msghdr msg;
  iovec iov;
  sockaddr_storage addr;
  undefined1 local_148 [8];
  DatagramReceiver local_140;
  OwnPromiseNode local_138;
  OwnPromiseNode local_130;
  undefined1 local_128 [8];
  PromiseFulfiller<void> *pPStack_120;
  iovec *local_118;
  PromiseFulfiller<void> *pPStack_110;
  cmsghdr *local_108;
  PromiseFulfiller<void> *pPStack_100;
  undefined8 local_f8;
  SourceLocation local_e8;
  iovec local_c8;
  Disposer local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  local_128 = (undefined1  [8])&local_b8;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8._vptr_Disposer = (_func_int **)0x0;
  uStack_b0 = 0;
  pPStack_120 = (PromiseFulfiller<void> *)0x80;
  local_c8.iov_base = *(void **)(in_RSI->bytes + 0x10);
  local_118 = &local_c8;
  local_c8.iov_len = *(size_t *)(in_RSI->bytes + 0x18);
  pPStack_110 = (PromiseFulfiller<void> *)0x1;
  local_108 = *(cmsghdr **)(in_RSI->bytes + 0x28);
  pPStack_100 = *(PromiseFulfiller<void> **)(in_RSI->bytes + 0x30);
  do {
    iVar12 = 0;
    sVar13 = recvmsg(*(int *)(*(long *)(in_RSI->bytes + 8) + 8),(msghdr *)local_128,0);
    if (-1 < sVar13) break;
    iVar12 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar12 == -1);
  if (iVar12 != 0) {
    local_140._vptr_DatagramReceiver = (_func_int **)0x0;
    local_e8.fileName = (char *)0x0;
    local_e8.function = (char *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_140,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_140);
  }
  local_138.ptr = (PromiseNode *)this;
  if (sVar13 < 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_148);
    auVar10 = local_148;
    pPVar7 = (PromiseArena *)
             ((SleepHooks *)&((PromiseArenaMember *)local_148)->arena)->_vptr_SleepHooks;
    if (pPVar7 == (PromiseArena *)0x0 || (ulong)((long)local_148 - (long)pPVar7) < 0x28) {
      pvVar14 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar14 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_148,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1868:55)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar14 + 0x3d8) = &PTR_destroy_0070e420;
      *(PromiseArena **)((long)pvVar14 + 0x3f8) = in_RSI;
      *(void **)((long)pvVar14 + 0x3e0) = pvVar14;
    }
    else {
      ((SleepHooks *)&((PromiseArenaMember *)local_148)->arena)->_vptr_SleepHooks =
           (_func_int **)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)((long)local_148 + -0x30))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_148,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1868:55)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      ((PromiseArenaMember *)((long)auVar10 + -0x30))->arena = (PromiseArena *)&PTR_destroy_0070e420
      ;
      ((PromiseArenaMember *)((long)auVar10 + -0x10))->arena = in_RSI;
      ((PromiseArenaMember *)((long)auVar10 + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)pPVar7;
    }
    local_e8.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_e8.function = "then";
    local_e8.lineNumber = 0x58b;
    local_e8.columnNumber = 0x4c;
    local_130.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_140,&local_130,&local_e8);
    node.ptr = local_130.ptr;
    (this->super_DatagramReceiver)._vptr_DatagramReceiver = local_140._vptr_DatagramReceiver;
    if ((TransformPromiseNodeBase *)local_130.ptr != (TransformPromiseNodeBase *)0x0) {
      local_130.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    auVar10 = local_148;
    if (local_148 != (undefined1  [8])0x0) {
      local_148 = (undefined1  [8])0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar10);
    }
  }
  else {
    puVar2 = *(undefined8 **)(*(long *)(in_RSI->bytes + 8) + 0x20);
    cVar11 = (**(code **)*puVar2)(puVar2,local_128,(ulong)pPStack_120 & 0xffffffff);
    if (cVar11 == '\0') {
      receive(this);
    }
    else {
      *(ssize_t *)(in_RSI->bytes + 0x60) = sVar13;
      in_RSI->bytes[0x68] = local_f8._0_1_ >> 5 & 1;
      uVar3 = *(undefined8 *)(*(long *)(in_RSI->bytes + 8) + 0x10);
      uVar4 = *(undefined8 *)(*(long *)(in_RSI->bytes + 8) + 0x20);
      if (in_RSI->bytes[0x70] == '\x01') {
        in_RSI->bytes[0x70] = '\0';
        lVar5 = *(long *)(in_RSI->bytes + 0x118);
        if (lVar5 != 0) {
          uVar6 = *(undefined8 *)(in_RSI->bytes + 0x120);
          in_RSI->bytes[0x118] = '\0';
          in_RSI->bytes[0x119] = '\0';
          in_RSI->bytes[0x11a] = '\0';
          in_RSI->bytes[0x11b] = '\0';
          in_RSI->bytes[0x11c] = '\0';
          in_RSI->bytes[0x11d] = '\0';
          in_RSI->bytes[0x11e] = '\0';
          in_RSI->bytes[0x11f] = '\0';
          in_RSI->bytes[0x120] = '\0';
          in_RSI->bytes[0x121] = '\0';
          in_RSI->bytes[0x122] = '\0';
          in_RSI->bytes[0x123] = '\0';
          in_RSI->bytes[0x124] = '\0';
          in_RSI->bytes[0x125] = '\0';
          in_RSI->bytes[0x126] = '\0';
          in_RSI->bytes[0x127] = '\0';
          (**(code **)**(undefined8 **)(in_RSI->bytes + 0x128))
                    (*(undefined8 **)(in_RSI->bytes + 0x128),lVar5,0x88,uVar6,uVar6,0);
        }
        AsyncObject::~AsyncObject((AsyncObject *)(in_RSI->bytes + 0x100));
      }
      SocketAddress::SocketAddress
                ((SocketAddress *)(in_RSI->bytes + 0x78),(void *)local_128,(uint)pPStack_120);
      *(undefined ***)(in_RSI->bytes + 0x100) = &PTR_connect_0070d950;
      *(undefined8 *)(in_RSI->bytes + 0x108) = uVar3;
      *(undefined8 *)(in_RSI->bytes + 0x110) = uVar4;
      *(SocketAddress **)(in_RSI->bytes + 0x118) = (SocketAddress *)(in_RSI->bytes + 0x78);
      in_RSI->bytes[0x120] = '\x01';
      in_RSI->bytes[0x121] = '\0';
      in_RSI->bytes[0x122] = '\0';
      in_RSI->bytes[0x123] = '\0';
      in_RSI->bytes[0x124] = '\0';
      in_RSI->bytes[0x125] = '\0';
      in_RSI->bytes[0x126] = '\0';
      in_RSI->bytes[0x127] = '\0';
      *(undefined8 **)(in_RSI->bytes + 0x128) = &NullArrayDisposer::instance;
      in_RSI->bytes[0x130] = '\0';
      in_RSI->bytes[0x131] = '\0';
      in_RSI->bytes[0x132] = '\0';
      in_RSI->bytes[0x133] = '\0';
      in_RSI->bytes[0x70] = '\x01';
      puVar2 = *(undefined8 **)(in_RSI->bytes + 0x40);
      puVar16 = *(undefined8 **)(in_RSI->bytes + 0x48);
      if (puVar16 < puVar2) {
        do {
          *(undefined8 **)(in_RSI->bytes + 0x48) = puVar16 + 3;
          *puVar16 = 0;
          puVar16[1] = 0;
          puVar16[2] = 0;
          puVar16 = *(undefined8 **)(in_RSI->bytes + 0x48);
        } while (puVar16 < puVar2);
      }
      else {
        *(undefined8 **)(in_RSI->bytes + 0x48) = puVar2;
      }
      in_RSI->bytes[0x69] = local_f8._0_1_ >> 3 & 1;
      if (local_108 != (cmsghdr *)0x0 && (PromiseFulfiller<void> *)0xf < pPStack_100) {
        __cmsg = local_108;
        do {
          uVar15 = (*(long *)(in_RSI->bytes + 0x28) + *(long *)(in_RSI->bytes + 0x30)) -
                   (long)__cmsg;
          if (uVar15 < 0x10) break;
          uVar17 = __cmsg->cmsg_len;
          if (uVar15 < __cmsg->cmsg_len) {
            uVar17 = uVar15;
          }
          iVar12 = __cmsg->cmsg_level;
          iVar1 = __cmsg->cmsg_type;
          lVar5 = *(long *)(in_RSI->bytes + 0x50);
          if (*(long *)(in_RSI->bytes + 0x48) == lVar5) {
            lVar8 = *(long *)(in_RSI->bytes + 0x40);
            newSize = (lVar5 - lVar8 >> 3) * 0x5555555555555556;
            if (lVar5 == lVar8) {
              newSize = 4;
            }
            Vector<kj::AncillaryMessage>::setCapacity
                      ((Vector<kj::AncillaryMessage> *)(in_RSI->bytes + 0x40),newSize);
          }
          piVar9 = *(int **)(in_RSI->bytes + 0x48);
          *piVar9 = iVar12;
          piVar9[1] = iVar1;
          *(cmsghdr **)(piVar9 + 2) = __cmsg + 1;
          *(ulong *)(piVar9 + 4) = uVar17 - 0x10;
          *(long *)(in_RSI->bytes + 0x48) = *(long *)(in_RSI->bytes + 0x48) + 0x18;
          __cmsg = __cmsg_nxthdr((msghdr *)local_128,__cmsg);
        } while (__cmsg != (cmsghdr *)0x0);
      }
      kj::_::readyNow();
      ((local_138.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember =
           (_func_int **)local_e8.fileName;
    }
  }
  return (Promise<void>)local_138.ptr;
}

Assistant:

Promise<void> receive() override {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct sockaddr_storage addr;
    memset(&addr, 0, sizeof(addr));
    msg.msg_name = &addr;
    msg.msg_namelen = sizeof(addr);

    struct iovec iov;
    iov.iov_base = contentBuffer.begin();
    iov.iov_len = contentBuffer.size();
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;
    msg.msg_control = ancillaryBuffer.begin();
    msg.msg_controllen = ancillaryBuffer.size();

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(port.fd, &msg, 0));

    if (n < 0) {
      // No data available. Wait.
      return port.observer.whenBecomesReadable().then([this]() {
        return receive();
      });
    } else {
      if (!port.filter.shouldAllow(reinterpret_cast<const struct sockaddr*>(msg.msg_name),
                                   msg.msg_namelen)) {
        // Ignore message from disallowed source.
        return receive();
      }

      receivedSize = n;
      contentTruncated = msg.msg_flags & MSG_TRUNC;

      source.emplace(port.lowLevel, port.filter, msg.msg_name, msg.msg_namelen);

      ancillaryList.resize(0);
      ancillaryTruncated = msg.msg_flags & MSG_CTRUNC;

      for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != nullptr;
           cmsg = CMSG_NXTHDR(&msg, cmsg)) {
        // On some platforms (OSX), a cmsghdr's length may cross the end of the ancillary buffer
        // when truncated. On other platforms (Linux) the length in cmsghdr will itself be
        // truncated to fit within the buffer.

#if __APPLE__
// On MacOS, `CMSG_SPACE(0)` triggers a bogus warning.
#pragma GCC diagnostic ignored "-Wnull-pointer-arithmetic"
#endif
        const byte* pos = reinterpret_cast<const byte*>(cmsg);
        size_t available = ancillaryBuffer.end() - pos;
        if (available < CMSG_SPACE(0)) {
          // The buffer ends in the middle of the header. We can't use this message.
          // (On Linux, this never happens, because the message is not included if there isn't
          // space for a header. I'm not sure how other systems behave, though, so let's be safe.)
          break;
        }

        // OK, we know the cmsghdr is valid, at least.

        // Find the start of the message payload.
        const byte* begin = (const byte *)CMSG_DATA(cmsg);

        // Cap the message length to the available space.
        const byte* end = pos + kj::min(available, cmsg->cmsg_len);

        ancillaryList.add(AncillaryMessage(
            cmsg->cmsg_level, cmsg->cmsg_type, arrayPtr(begin, end)));
      }

      return READY_NOW;
    }
  }